

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void SerializeMany<ParamsStream<DataStream&,TransactionSerParams>,long,CScript>
               (ParamsStream<DataStream_&,_TransactionSerParams> *s,long *args,CScript *args_1)

{
  long in_FS_OFFSET;
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = *args;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)s->m_substream,
             (s->m_substream->vch).
             super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_20);
  SerializeMany<ParamsStream<DataStream&,TransactionSerParams>,prevector<28u,unsigned_char,unsigned_int,int>>
            (s,&args_1->super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}